

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack8(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  uint uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar15 [64];
  
  if (0x1f < bs + 0x1f) {
    auVar18._8_8_ = 0x800000010;
    auVar18._0_8_ = 0x800000010;
    auVar8 = vpmovsxbd_avx512f(_DAT_00194430);
    auVar9 = vpmovsxbd_avx512f(_DAT_00194440);
    auVar10 = vbroadcasti32x4_avx512f(_DAT_00194410);
    auVar11 = vbroadcasti32x4_avx512f(_DAT_00194420);
    uVar6 = bs + 0x1f >> 5;
    lVar5 = 0;
    auVar2 = vpshufd_avx(auVar18,0x50);
    do {
      uVar1 = *(undefined4 *)((long)in + lVar5);
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar7 = vpbroadcastd_avx512vl();
      auVar12 = vpbroadcastd_avx512f();
      auVar3 = vpsrlvd_avx2(auVar12._0_16_,auVar18);
      auVar4 = vpsrlvd_avx2(auVar19,auVar2);
      auVar4 = vpblendd_avx2(auVar4,auVar19,1);
      auVar12 = vinserti32x8_avx512dq(ZEXT1664(auVar18),auVar7,0);
      auVar19 = vpsrlvd_avx2(auVar7._0_16_,auVar2);
      auVar13 = vpbroadcastd_avx512f();
      auVar7._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar18;
      auVar7._16_16_ = ZEXT116(1) * auVar19;
      auVar19 = vpsrlvd_avx2(auVar13._0_16_,auVar18);
      auVar7 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar12._16_4_,auVar4)),auVar7,0x60);
      auVar12 = vpbroadcastd_avx512f();
      auVar12 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar12._32_4_,auVar7)),auVar8,ZEXT1664(auVar3))
      ;
      auVar13 = vpbroadcastd_avx512f();
      auVar14 = vpbroadcastd_avx512f();
      auVar15._0_48_ = auVar12._0_48_;
      auVar15._48_4_ = auVar14._48_4_;
      auVar15._52_4_ = auVar12._52_4_;
      auVar15._56_4_ = auVar12._56_4_;
      auVar15._60_4_ = auVar12._60_4_;
      auVar3 = vpsrlvd_avx2(auVar13._0_16_,auVar18);
      auVar12 = vmovdqa64_avx512f(auVar15);
      auVar12 = vpermt2d_avx512f(auVar12,auVar9,ZEXT1664(auVar19));
      auVar12 = vpandd_avx512f(auVar12,auVar11);
      auVar13 = vpsrlvd_avx512f(auVar15,auVar10);
      auVar14._0_4_ = auVar13._0_4_;
      auVar14._4_4_ = auVar12._4_4_;
      auVar14._8_4_ = auVar12._8_4_;
      auVar14._12_4_ = auVar12._12_4_;
      auVar14._16_4_ = auVar13._16_4_;
      auVar14._20_4_ = auVar12._20_4_;
      auVar14._24_4_ = auVar12._24_4_;
      auVar14._28_4_ = auVar12._28_4_;
      auVar14._32_4_ = auVar13._32_4_;
      auVar14._36_4_ = auVar12._36_4_;
      auVar14._40_4_ = auVar12._40_4_;
      auVar14._44_4_ = auVar12._44_4_;
      auVar14._48_4_ = auVar13._48_4_;
      auVar14._52_4_ = auVar12._52_4_;
      auVar14._56_4_ = auVar12._56_4_;
      auVar14._60_4_ = auVar12._60_4_;
      uVar1 = *(undefined4 *)((long)in + lVar5 + 0x10);
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._8_4_ = uVar1;
      auVar20._12_4_ = uVar1;
      auVar12 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(out + lVar5) = auVar12;
      auVar7 = vpbroadcastd_avx512vl();
      auVar12 = vpbroadcastd_avx512f();
      auVar19 = vpsrlvd_avx2(auVar12._0_16_,auVar18);
      auVar4 = vpsrlvd_avx2(auVar20,auVar2);
      auVar4 = vpblendd_avx2(auVar4,auVar20,1);
      auVar12 = vinserti32x8_avx512dq(ZEXT1664(auVar18),auVar7,0);
      auVar20 = vpsrlvd_avx2(auVar7._0_16_,auVar2);
      auVar21._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar18;
      auVar21._16_16_ = ZEXT116(1) * auVar20;
      auVar7 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar12._16_4_,auVar4)),auVar21,0x60);
      auVar12 = vpbroadcastd_avx512f();
      auVar12 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar12._32_4_,auVar7)),auVar8,ZEXT1664(auVar3))
      ;
      auVar13 = vpbroadcastd_avx512f();
      auVar16._0_48_ = auVar12._0_48_;
      auVar16._48_4_ = auVar13._48_4_;
      auVar16._52_4_ = auVar12._52_4_;
      auVar16._56_4_ = auVar12._56_4_;
      auVar16._60_4_ = auVar12._60_4_;
      auVar12 = vmovdqa64_avx512f(auVar16);
      auVar12 = vpermt2d_avx512f(auVar12,auVar9,ZEXT1664(auVar19));
      auVar12 = vpandd_avx512f(auVar12,auVar11);
      auVar13 = vpsrlvd_avx512f(auVar16,auVar10);
      auVar17._0_4_ = auVar13._0_4_;
      auVar17._4_4_ = auVar12._4_4_;
      auVar17._8_4_ = auVar12._8_4_;
      auVar17._12_4_ = auVar12._12_4_;
      auVar17._16_4_ = auVar13._16_4_;
      auVar17._20_4_ = auVar12._20_4_;
      auVar17._24_4_ = auVar12._24_4_;
      auVar17._28_4_ = auVar12._28_4_;
      auVar17._32_4_ = auVar13._32_4_;
      auVar17._36_4_ = auVar12._36_4_;
      auVar17._40_4_ = auVar12._40_4_;
      auVar17._44_4_ = auVar12._44_4_;
      auVar17._48_4_ = auVar13._48_4_;
      auVar17._52_4_ = auVar12._52_4_;
      auVar17._56_4_ = auVar12._56_4_;
      auVar17._60_4_ = auVar12._60_4_;
      auVar12 = vmovdqu64_avx512f(auVar17);
      *(undefined1 (*) [64])(out + lVar5 + 0x10) = auVar12;
      lVar5 = lVar5 + 0x20;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack8(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 8, --bs) {
    out[0] = in[0] >> 24;
    out[1] = (in[0] >> 16) & 0xff;
    out[2] = (in[0] >> 8) & 0xff;
    out[3] = in[0] & 0xff;
    out[4] = in[1] >> 24;
    out[5] = (in[1] >> 16) & 0xff;
    out[6] = (in[1] >> 8) & 0xff;
    out[7] = in[1] & 0xff;
    out[8] = in[2] >> 24;
    out[9] = (in[2] >> 16) & 0xff;
    out[10] = (in[2] >> 8) & 0xff;
    out[11] = in[2] & 0xff;
    out[12] = in[3] >> 24;
    out[13] = (in[3] >> 16) & 0xff;
    out[14] = (in[3] >> 8) & 0xff;
    out[15] = in[3] & 0xff;
    out[16] = in[4] >> 24;
    out[17] = (in[4] >> 16) & 0xff;
    out[18] = (in[4] >> 8) & 0xff;
    out[19] = in[4] & 0xff;
    out[20] = in[5] >> 24;
    out[21] = (in[5] >> 16) & 0xff;
    out[22] = (in[5] >> 8) & 0xff;
    out[23] = in[5] & 0xff;
    out[24] = in[6] >> 24;
    out[25] = (in[6] >> 16) & 0xff;
    out[26] = (in[6] >> 8) & 0xff;
    out[27] = in[6] & 0xff;
    out[28] = in[7] >> 24;
    out[29] = (in[7] >> 16) & 0xff;
    out[30] = (in[7] >> 8) & 0xff;
    out[31] = in[7] & 0xff;
  }
}